

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

int __thiscall
Catch::Detail::anon_unknown_3::
StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL>::overflow
          (StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL> *this,int c
          )

{
  string *str;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  sync(this);
  if (c != -1) {
    if (*(long *)&this->field_0x20 == *(long *)&this->field_0x30) {
      local_30[0] = local_20;
      str = (string *)0x1;
      std::__cxx11::string::_M_construct((ulong)local_30,'\x01');
      OutputDebugWriter::operator()((OutputDebugWriter *)local_30,str);
      std::__cxx11::string::~string((string *)local_30);
    }
    else {
      std::streambuf::sputc((char)this);
    }
  }
  return 0;
}

Assistant:

int overflow( int c ) override {
                sync();

                if( c != EOF ) {
                    if( pbase() == epptr() )
                        m_writer( std::string( 1, static_cast<char>( c ) ) );
                    else
                        sputc( static_cast<char>( c ) );
                }
                return 0;
            }